

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
write_decimal<long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
           *this,longlong value)

{
  type_conflict4 tVar1;
  type pcVar2;
  type out;
  uint64_t in_RSI;
  size_t in_RDI;
  type *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
  *in_stack_ffffffffffffffd0;
  uint64_t local_18;
  
  tVar1 = internal::is_negative<long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar1) {
    local_18 = -in_RSI;
  }
  internal::count_digits(local_18);
  pcVar2 = reserve(in_stack_ffffffffffffffd0,in_RDI);
  out = pcVar2;
  if (tVar1) {
    out = pcVar2 + 1;
    *pcVar2 = 0x2d;
  }
  internal::format_decimal<fmt::v5::char8_t,fmt::v5::char8_t*,unsigned_long>(out,in_RDI,0);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }